

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_chart_begin_colored
              (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
              float min_value,float max_value)

{
  nk_vec2 nVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_rect r;
  nk_rect r_00;
  nk_widget_layout_states nVar4;
  int iVar5;
  nk_command_buffer *b;
  float fVar6;
  float fVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  nk_rect nVar10;
  nk_rect bounds;
  
  bounds.x = 0.0;
  bounds.y = 0.0;
  bounds.w = 0.0;
  bounds.h = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x54bc,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      nVar4 = nk_widget(&bounds,ctx);
      pnVar2 = ctx->current;
      pnVar3 = pnVar2->layout;
      if (nVar4 == NK_WIDGET_INVALID) {
        nk_zero(&pnVar3->chart,0xb4);
        iVar5 = 0;
      }
      else {
        nk_zero(&pnVar3->chart,0xb4);
        nVar1 = (ctx->style).chart.padding;
        fVar6 = nVar1.x;
        fVar9 = nVar1.y;
        (pnVar3->chart).x = bounds.x + fVar6;
        (pnVar3->chart).y = bounds.y + fVar9;
        auVar7._0_4_ = fVar6 + fVar6;
        auVar7._4_4_ = fVar9 + fVar9;
        auVar7._8_8_ = 0;
        auVar8._4_4_ = bounds.h - auVar7._4_4_;
        auVar8._0_4_ = bounds.w - auVar7._0_4_;
        auVar8._8_8_ = 0;
        auVar8 = maxps(auVar7,auVar8);
        (pnVar3->chart).w = (float)(int)auVar8._0_8_;
        (pnVar3->chart).h = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
        iVar5 = (pnVar3->chart).slot;
        (pnVar3->chart).slot = iVar5 + 1;
        (pnVar3->chart).slots[iVar5].type = type;
        (pnVar3->chart).slots[iVar5].count = count;
        (pnVar3->chart).slots[iVar5].color = color;
        (pnVar3->chart).slots[iVar5].highlight = highlight;
        fVar6 = min_value;
        if (max_value <= min_value) {
          fVar6 = max_value;
        }
        (pnVar3->chart).slots[iVar5].min = fVar6;
        if (max_value <= min_value) {
          max_value = min_value;
        }
        (pnVar3->chart).slots[iVar5].max = max_value;
        (pnVar3->chart).slots[iVar5].range = max_value - fVar6;
        b = &pnVar2->buffer;
        if ((ctx->style).chart.background.type == NK_STYLE_ITEM_IMAGE) {
          r.w = bounds.w;
          r.h = bounds.h;
          r.x = bounds.x;
          r.y = bounds.y;
          nk_draw_image(b,r,&(ctx->style).chart.background.data.image,(nk_color)0xffffffff);
        }
        else {
          nVar10.w = bounds.w;
          nVar10.h = bounds.h;
          nVar10.x = bounds.x;
          nVar10.y = bounds.y;
          nk_fill_rect(b,nVar10,(ctx->style).chart.rounding,(ctx->style).chart.border_color);
          r_00.w = bounds.w;
          r_00.h = bounds.h;
          r_00.x = bounds.x;
          r_00.y = bounds.y;
          nVar10 = nk_shrink_rect(r_00,(ctx->style).chart.border);
          nk_fill_rect(b,nVar10,(ctx->style).chart.rounding,(ctx->style).chart.background.data.color
                      );
        }
        iVar5 = 1;
      }
      return iVar5;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x54be,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x54bd,
                "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
               );
}

Assistant:

NK_API int
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
    struct nk_color color, struct nk_color highlight,
    int count, float min_value, float max_value)
{
    struct nk_window *win;
    struct nk_chart *chart;
    const struct nk_style *config;
    const struct nk_style_chart *style;

    const struct nk_style_item *background;
    struct nk_rect bounds = {0, 0, 0, 0};

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);

    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    if (!nk_widget(&bounds, ctx)) {
        chart = &ctx->current->layout->chart;
        nk_zero(chart, sizeof(*chart));
        return 0;
    }

    win = ctx->current;
    config = &ctx->style;
    chart = &win->layout->chart;
    style = &config->chart;

    /* setup basic generic chart  */
    nk_zero(chart, sizeof(*chart));
    chart->x = bounds.x + style->padding.x;
    chart->y = bounds.y + style->padding.y;
    chart->w = bounds.w - 2 * style->padding.x;
    chart->h = bounds.h - 2 * style->padding.y;
    chart->w = NK_MAX(chart->w, 2 * style->padding.x);
    chart->h = NK_MAX(chart->h, 2 * style->padding.y);

    /* add first slot into chart */
    {struct nk_chart_slot *slot = &chart->slots[chart->slot++];
    slot->type = type;
    slot->count = count;
    slot->color = color;
    slot->highlight = highlight;
    slot->min = NK_MIN(min_value, max_value);
    slot->max = NK_MAX(min_value, max_value);
    slot->range = slot->max - slot->min;}

    /* draw chart background */
    background = &style->background;
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
        nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
            style->rounding, style->background.data.color);
    }
    return 1;
}